

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelside.cpp
# Opt level: O1

void __thiscall TPZGeoElSide::RemoveConnectivity(TPZGeoElSide *this)

{
  int iVar1;
  int iVar2;
  TPZGeoEl *pTVar3;
  TPZGeoElSide neigh;
  TPZGeoElSide neighpos;
  undefined **local_78;
  TPZGeoEl *local_70;
  int local_68;
  undefined **local_60;
  TPZGeoEl *local_58;
  int local_50;
  TPZGeoElSide local_48;
  
  iVar2 = this->fSide;
  if (-1 < iVar2 && this->fGeoEl != (TPZGeoEl *)0x0) {
    iVar1 = (**(code **)(*(long *)this->fGeoEl + 0xf0))();
    if (iVar1 <= iVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"TPZGeoElSide::RemoveConnectivity Index out of bound\n",0x34)
      ;
    }
    pTVar3 = this->fGeoEl;
    if (pTVar3 == (TPZGeoEl *)0x0) {
      local_78 = &PTR__TPZGeoElSide_01920090;
      local_70 = (TPZGeoEl *)0x0;
      local_68 = -1;
    }
    else {
      (**(code **)(*(long *)pTVar3 + 0x188))(&local_78,pTVar3,this->fSide);
    }
    if ((local_70 == (TPZGeoEl *)0x0) || (local_68 == -1)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TPZGeoElSide::RemoveConnectivity trying to remove null or inexistent connection",
                 0x4f);
    }
    local_60 = &PTR__TPZGeoElSide_01920090;
    local_58 = local_70;
    local_50 = local_68;
    iVar2 = -1;
    if ((local_68 < 0 || local_70 == (TPZGeoEl *)0x0) ||
       ((local_70 == this->fGeoEl && (local_68 == this->fSide)))) {
      pTVar3 = (TPZGeoEl *)0x0;
    }
    else {
      do {
        iVar2 = local_68;
        pTVar3 = local_70;
        (**(code **)(*(long *)local_70 + 0x188))(&local_48,local_70);
        local_68 = local_48.fSide;
        local_70 = local_48.fGeoEl;
        if ((local_48.fGeoEl == (TPZGeoEl *)0x0) || (local_48.fSide < 0)) break;
      } while ((local_48.fGeoEl != this->fGeoEl) || (local_48.fSide != this->fSide));
    }
    if ((local_70 == this->fGeoEl) && (local_68 == this->fSide)) {
      local_48.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_01920090;
      local_48.fGeoEl = (TPZGeoEl *)0x0;
      local_48.fSide = -1;
      SetNeighbour(this,&local_48);
      if (-1 < iVar2 && pTVar3 != (TPZGeoEl *)0x0) {
        (**(code **)(*(long *)pTVar3 + 0x198))(pTVar3,iVar2,&local_60);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"TPZGeoElSide::RemoveConnectivity neighbourhood cycle error",
                 0x3a);
    }
  }
  return;
}

Assistant:

void TPZGeoElSide::RemoveConnectivity(){
	
	if(!Exists()) return;
	if(fSide < 0 || fSide >= fGeoEl->NSides()) {
		PZError << "TPZGeoElSide::RemoveConnectivity Index out of bound\n";
	}
	//it removes the connectivity of the cycle where this inserted one: 
	//neighpre->this->neighpos => neighpre->neighpos
	TPZGeoElSide neighpre,neigh = Neighbour();
	if(neigh.Element() == NULL || neigh.Side() == -1){
		PZError << "TPZGeoElSide::RemoveConnectivity trying to remove null or inexistent connection";
	}
	TPZGeoElSide neighpos = neigh;
	while(neigh.Exists() && neigh != *this){
		neighpre = neigh;
		neigh = neigh.Neighbour();
	}
	if(neigh == *this){
		this->SetNeighbour(TPZGeoElSide());
		if (neighpre.Exists()) neighpre.SetNeighbour(neighpos);
	} else {
		PZError << "TPZGeoElSide::RemoveConnectivity neighbourhood cycle error";
	}
}